

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O2

void duckdb::RLEScanConstant<unsigned_char>
               (RLEScanState<unsigned_char> *scan_state,rle_count_t *index_pointer,
               uchar *data_pointer,idx_t scan_count,Vector *result)

{
  ulong uVar1;
  
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  *result->data = data_pointer[scan_state->entry_pos];
  uVar1 = scan_count + scan_state->position_in_entry;
  scan_state->position_in_entry = uVar1;
  if (index_pointer[scan_state->entry_pos] <= uVar1) {
    scan_state->entry_pos = scan_state->entry_pos + 1;
    scan_state->position_in_entry = 0;
  }
  return;
}

Assistant:

static void RLEScanConstant(RLEScanState<T> &scan_state, rle_count_t *index_pointer, T *data_pointer, idx_t scan_count,
                            Vector &result) {
	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	auto result_data = ConstantVector::GetData<T>(result);
	result_data[0] = data_pointer[scan_state.entry_pos];
	scan_state.position_in_entry += scan_count;
	if (scan_state.ExhaustedRun(index_pointer)) {
		scan_state.ForwardToNextRun();
	}
	return;
}